

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_die_deliv.c
# Opt level: O3

int dwarf_get_die_section_name_b(Dwarf_Die die,char **sec_name,Dwarf_Error *error)

{
  Dwarf_CU_Context_conflict pDVar1;
  Dwarf_Debug dbg;
  int iVar2;
  Dwarf_Signed errval;
  
  if (die == (Dwarf_Die)0x0) {
    errval = 0x34;
  }
  else {
    pDVar1 = die->di_cu_context;
    if (pDVar1 != (Dwarf_CU_Context_conflict)0x0) {
      dbg = pDVar1->cc_dbg;
      if ((dbg != (Dwarf_Debug)0x0) && (dbg->de_magic == 0xebfdebfd)) {
        iVar2 = dwarf_get_die_section_name(dbg,pDVar1->cc_is_info,sec_name,error);
        return iVar2;
      }
      _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                          "DW_DLE_DBG_NULL: accesing a cu context, Dwarf_Debug either null or it containsa stale Dwarf_Debug pointer"
                         );
      return 1;
    }
    errval = 0x68;
  }
  _dwarf_error((Dwarf_Debug)0x0,error,errval);
  return 1;
}

Assistant:

int
dwarf_get_die_section_name_b(Dwarf_Die die,
    const char ** sec_name,
    Dwarf_Error * error)
{
    Dwarf_CU_Context context = 0;
    Dwarf_Bool is_info = 0;
    Dwarf_Debug dbg = 0;

    CHECK_DIE(die, DW_DLV_ERROR);
    context = die->di_cu_context;
    dbg = context->cc_dbg;
    is_info = context->cc_is_info;
    return dwarf_get_die_section_name(dbg,is_info,sec_name,error);
}